

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* NJamSpell::GetDeletes1
            (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *__return_storage_ptr__,wstring *w)

{
  ulong uVar1;
  wstring local_98 [48];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> nw;
  ulong local_28;
  size_t i;
  wstring *w_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *results;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar1 = std::__cxx11::wstring::size(), local_28 < uVar1;
      local_28 = local_28 + 1) {
    std::__cxx11::wstring::substr((ulong)local_68,(ulong)w);
    std::__cxx11::wstring::substr((ulong)local_98,(ulong)w);
    std::operator+(local_48,local_68);
    std::__cxx11::wstring::~wstring(local_98);
    std::__cxx11::wstring::~wstring((wstring *)local_68);
    uVar1 = std::__cxx11::wstring::empty();
    if ((uVar1 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back(__return_storage_ptr__,local_48);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::wstring> GetDeletes1(const std::wstring& w) {
    std::vector<std::wstring> results;
    for (size_t i = 0; i < w.size(); ++i) {
        auto nw = w.substr(0, i) + w.substr(i+1);
        if (!nw.empty()) {
            results.push_back(nw);
        }
    }
    return results;
}